

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

void vkt::tessellation::beginRenderPassWithRasterizationDisabled
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,VkRenderPass renderPass,
               VkFramebuffer framebuffer)

{
  undefined4 local_40 [2];
  undefined8 local_38;
  deUint64 local_30;
  deUint64 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  undefined8 local_8;
  
  local_20 = 0;
  uStack_18 = 0;
  local_40[0] = 0x2b;
  local_38 = 0;
  local_10 = 0;
  local_8 = 0;
  local_30 = renderPass.m_internal;
  local_28 = framebuffer.m_internal;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,local_40,0);
  return;
}

Assistant:

void beginRenderPassWithRasterizationDisabled (const DeviceInterface&	vk,
											   const VkCommandBuffer	commandBuffer,
											   const VkRenderPass		renderPass,
											   const VkFramebuffer		framebuffer)
{
	const VkRect2D renderArea = {{ 0, 0 }, { 0, 0 }};

	const VkRenderPassBeginInfo renderPassBeginInfo = {
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		renderPass,										// VkRenderPass            renderPass;
		framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		0u,												// uint32_t                clearValueCount;
		DE_NULL,										// const VkClearValue*     pClearValues;
	};

	vk.cmdBeginRenderPass(commandBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
}